

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlSchemaTypePtr xmlSchemaGetPredefinedType(xmlChar *name,xmlChar *ns)

{
  int iVar1;
  xmlChar *ns_local;
  xmlChar *name_local;
  
  if ((xmlSchemaTypesInitialized == 0) && (iVar1 = xmlSchemaInitTypes(), iVar1 < 0)) {
    return (xmlSchemaTypePtr)0x0;
  }
  if (name == (xmlChar *)0x0) {
    name_local = (xmlChar *)0x0;
  }
  else {
    name_local = (xmlChar *)xmlHashLookup2(xmlSchemaTypesBank,name,ns);
  }
  return (xmlSchemaTypePtr)name_local;
}

Assistant:

xmlSchemaTypePtr
xmlSchemaGetPredefinedType(const xmlChar *name, const xmlChar *ns) {
    if ((xmlSchemaTypesInitialized == 0) &&
	(xmlSchemaInitTypes() < 0))
        return (NULL);
    if (name == NULL)
	return(NULL);
    return((xmlSchemaTypePtr) xmlHashLookup2(xmlSchemaTypesBank, name, ns));
}